

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindRulePrecedences(lemon *xp)

{
  int *piVar1;
  symbol ***pppsVar2;
  rule *prVar3;
  long lVar4;
  symbol *psVar5;
  long lVar6;
  
  prVar3 = xp->rule;
  do {
    if (prVar3 == (rule *)0x0) {
      return;
    }
    if ((prVar3->precsym == (symbol *)0x0) && (0 < (long)prVar3->nrhs)) {
      lVar4 = 0;
      psVar5 = (symbol *)0x0;
      do {
        if (psVar5 != (symbol *)0x0) break;
        psVar5 = prVar3->rhs[lVar4];
        if (psVar5->type == MULTITERMINAL) {
          piVar1 = &psVar5->nsubsym;
          if (0 < (long)*piVar1) {
            pppsVar2 = &psVar5->subsym;
            lVar6 = 0;
            do {
              psVar5 = (*pppsVar2)[lVar6];
              if (-1 < psVar5->prec) goto LAB_00103e53;
              lVar6 = lVar6 + 1;
            } while (*piVar1 != lVar6);
          }
LAB_00103e59:
          psVar5 = (symbol *)0x0;
        }
        else {
          if (psVar5->prec < 0) goto LAB_00103e59;
LAB_00103e53:
          prVar3->precsym = psVar5;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != prVar3->nrhs);
    }
    prVar3 = prVar3->next;
  } while( true );
}

Assistant:

void FindRulePrecedences(struct lemon *xp)
{
  struct rule *rp;
  for(rp=xp->rule; rp; rp=rp->next){
    if( rp->precsym==0 ){
      int i, j;
      for(i=0; i<rp->nrhs && rp->precsym==0; i++){
        struct symbol *sp = rp->rhs[i];
        if( sp->type==MULTITERMINAL ){
          for(j=0; j<sp->nsubsym; j++){
            if( sp->subsym[j]->prec>=0 ){
              rp->precsym = sp->subsym[j];
              break;
            }
          }
        }else if( sp->prec>=0 ){
          rp->precsym = rp->rhs[i];
	}
      }
    }
  }
  return;
}